

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void MouseButtonCallback(GLFWwindow *window,int button,int action,int mods)

{
  GestureEvent event;
  undefined1 auVar1 [48];
  char cVar2;
  GestureEvent gestureEvent;
  undefined8 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  
  cVar2 = (char)action;
  CORE.Input.Mouse.currentButtonState[button] = cVar2;
  uVar3 = 0;
  if ((cVar2 == '\x01') && (CORE.Input.Mouse.previousButtonState[button] == '\0')) {
    uVar3 = 1;
  }
  else if ((cVar2 == '\0') && (CORE.Input.Mouse.previousButtonState[button] == '\x01')) {
    uVar3 = 0;
  }
  auVar1 = ZEXT3248(CONCAT428(1,CONCAT424(uVar3,CONCAT816(in_stack_ffffffffffffffc0,ZEXT816(0)))));
  event.position[3].x =
       ((CORE.Input.Mouse.position.x + CORE.Input.Mouse.offset.x) * CORE.Input.Mouse.scale.x) /
       (float)(int)CORE.Window.currentFbo.width;
  event.touchAction = auVar1._0_4_;
  event.pointCount = auVar1._4_4_;
  event.pointerId[0] = auVar1._8_4_;
  event.pointerId[1] = auVar1._12_4_;
  event.pointerId[2] = auVar1._16_4_;
  event.pointerId[3] = auVar1._20_4_;
  event.position[0].x = (float)(int)auVar1._24_8_;
  event.position[0].y = (float)(int)((ulong)auVar1._24_8_ >> 0x20);
  event.position[1].x = (float)(int)auVar1._32_8_;
  event.position[1].y = (float)(int)((ulong)auVar1._32_8_ >> 0x20);
  event.position[2].x = (float)(int)auVar1._40_8_;
  event.position[2].y = (float)(int)((ulong)auVar1._40_8_ >> 0x20);
  event.position[3].y =
       ((CORE.Input.Mouse.position.y + CORE.Input.Mouse.offset.y) * CORE.Input.Mouse.scale.y) /
       (float)(int)CORE.Window.currentFbo.height;
  ProcessGestureEvent(event);
  return;
}

Assistant:

static void MouseButtonCallback(GLFWwindow *window, int button, int action, int mods)
{
    // WARNING: GLFW could only return GLFW_PRESS (1) or GLFW_RELEASE (0) for now,
    // but future releases may add more actions (i.e. GLFW_REPEAT)
    CORE.Input.Mouse.currentButtonState[button] = action;

#if defined(SUPPORT_GESTURES_SYSTEM) && defined(SUPPORT_MOUSE_GESTURES)
    // Process mouse events as touches to be able to use mouse-gestures
    GestureEvent gestureEvent = { 0 };

    // Register touch actions
    if ((CORE.Input.Mouse.currentButtonState[button] == 1) && (CORE.Input.Mouse.previousButtonState[button] == 0)) gestureEvent.touchAction = TOUCH_DOWN;
    else if ((CORE.Input.Mouse.currentButtonState[button] == 0) && (CORE.Input.Mouse.previousButtonState[button] == 1)) gestureEvent.touchAction = TOUCH_UP;

    // NOTE: TOUCH_MOVE event is registered in MouseCursorPosCallback()

    // Assign a pointer ID
    gestureEvent.pointerId[0] = 0;

    // Register touch points count
    gestureEvent.pointCount = 1;

    // Register touch points position, only one point registered
    gestureEvent.position[0] = GetMousePosition();

    // Normalize gestureEvent.position[0] for CORE.Window.screen.width and CORE.Window.screen.height
    gestureEvent.position[0].x /= (float)GetScreenWidth();
    gestureEvent.position[0].y /= (float)GetScreenHeight();

    // Gesture data is sent to gestures system for processing
    ProcessGestureEvent(gestureEvent);
#endif
}